

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O1

void __thiscall
Assimp::IFC::Schema_2x3::IfcLShapeProfileDef::~IfcLShapeProfileDef(IfcLShapeProfileDef *this)

{
  undefined1 *puVar1;
  bool *pbVar2;
  
  this[-1].Thickness = 4.24004370493341e-317;
  *(undefined8 *)&(this->super_IfcParameterizedProfileDef).field_0x80 = 0x82f360;
  puVar1 = *(undefined1 **)&this[-1].LegSlope.have;
  pbVar2 = &this[-1].CentreOfGravityInX.have;
  if ((bool *)puVar1 != pbVar2) {
    operator_delete(puVar1,*(long *)pbVar2 + 1);
  }
  puVar1 = *(undefined1 **)&this[-1].FilletRadius.have;
  pbVar2 = &this[-1].EdgeRadius.have;
  if ((bool *)puVar1 != pbVar2) {
    operator_delete(puVar1,*(long *)pbVar2 + 1);
  }
  operator_delete(&this[-1].Thickness,0x108);
  return;
}

Assistant:

IfcLShapeProfileDef() : Object("IfcLShapeProfileDef") {}